

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void instrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  u8 uVar1;
  u8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar *__s1;
  uchar *__s2;
  int iVal;
  
  uVar1 = (*argv)->type;
  uVar2 = argv[1]->type;
  if (uVar2 == '\x05' || uVar1 == '\x05') {
    return;
  }
  iVar3 = sqlite3_value_bytes(*argv);
  iVar4 = sqlite3_value_bytes(argv[1]);
  if (uVar2 == '\x04' && uVar1 == '\x04') {
    __s1 = (uchar *)sqlite3_value_blob(*argv);
    __s2 = (uchar *)sqlite3_value_blob(argv[1]);
  }
  else {
    __s1 = sqlite3_value_text(*argv);
    __s2 = sqlite3_value_text(argv[1]);
  }
  iVal = 1;
  for (; iVar4 <= iVar3; iVar3 = iVar3 + -1) {
    iVar5 = bcmp(__s1,__s2,(long)iVar4);
    if (iVar5 == 0) goto LAB_00164405;
    iVal = iVal + 1;
    __s1 = __s1 + 1;
  }
  iVal = 0;
LAB_00164405:
  sqlite3_result_int(context,iVal);
  return;
}

Assistant:

static void instrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zHaystack;
  const unsigned char *zNeedle;
  int nHaystack;
  int nNeedle;
  int typeHaystack, typeNeedle;
  int N = 1;
  int isText;

  UNUSED_PARAMETER(argc);
  typeHaystack = sqlite3_value_type(argv[0]);
  typeNeedle = sqlite3_value_type(argv[1]);
  if( typeHaystack==SQLITE_NULL || typeNeedle==SQLITE_NULL ) return;
  nHaystack = sqlite3_value_bytes(argv[0]);
  nNeedle = sqlite3_value_bytes(argv[1]);
  if( typeHaystack==SQLITE_BLOB && typeNeedle==SQLITE_BLOB ){
    zHaystack = sqlite3_value_blob(argv[0]);
    zNeedle = sqlite3_value_blob(argv[1]);
    isText = 0;
  }else{
    zHaystack = sqlite3_value_text(argv[0]);
    zNeedle = sqlite3_value_text(argv[1]);
    isText = 1;
  }
  while( nNeedle<=nHaystack && memcmp(zHaystack, zNeedle, nNeedle)!=0 ){
    N++;
    do{
      nHaystack--;
      zHaystack++;
    }while( isText && (zHaystack[0]&0xc0)==0x80 );
  }
  if( nNeedle>nHaystack ) N = 0;
  sqlite3_result_int(context, N);
}